

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewEntityRef(xmlDocPtr doc,xmlChar *name)

{
  xmlNodePtr pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlFreeFunc *pp_Var3;
  
  pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar1 == (xmlNodePtr)0x0) {
    pp_Var3 = &xmlFree;
  }
  else {
    pxVar1->_private = (void *)0x0;
    *(undefined8 *)&pxVar1->type = 0;
    pxVar1->doc = (_xmlDoc *)0x0;
    pxVar1->ns = (xmlNs *)0x0;
    pxVar1->name = (xmlChar *)0x0;
    pxVar1->children = (_xmlNode *)0x0;
    pxVar1->nsDef = (xmlNs *)0x0;
    pxVar1->psvi = (void *)0x0;
    pxVar1->content = (xmlChar *)0x0;
    pxVar1->properties = (_xmlAttr *)0x0;
    pxVar1->next = (_xmlNode *)0x0;
    pxVar1->prev = (_xmlNode *)0x0;
    pxVar1->last = (_xmlNode *)0x0;
    pxVar1->parent = (_xmlNode *)0x0;
    pxVar1->line = 0;
    pxVar1->extra = 0;
    *(undefined4 *)&pxVar1->field_0x74 = 0;
    pxVar1->type = XML_ENTITY_REF_NODE;
    pxVar1->doc = doc;
    pxVar1->name = name;
    if (xmlRegisterCallbacks == 0) {
      return pxVar1;
    }
    pp_Var2 = __xmlRegisterNodeDefaultValue();
    if (*pp_Var2 == (xmlRegisterNodeFunc)0x0) {
      return pxVar1;
    }
    pp_Var3 = (xmlFreeFunc *)__xmlRegisterNodeDefaultValue();
    name = (xmlChar *)pxVar1;
  }
  (**pp_Var3)((xmlNodePtr)name);
  return pxVar1;
}

Assistant:

static xmlNodePtr
xmlNewEntityRef(xmlDocPtr doc, xmlChar *name) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
        xmlFree(name);
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;
    cur->doc = doc;
    cur->name = name;

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);

    return(cur);
}